

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

float vkt::sr::anon_unknown_0::getSingleULPForExponent(int exp,int numMantissaBits)

{
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  float fVar2;
  
  if (numMantissaBits < 1) {
    fVar2 = (float)(exp * 0x800000 + 0x3f800000);
  }
  else {
    FVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                      (1,exp,1 << ((byte)(0x17 - (char)numMantissaBits) & 0x1f) | 0x800000);
    fVar2 = (float)FVar1.m_value - (float)(exp * 0x800000 + 0x3f800000);
  }
  return fVar2;
}

Assistant:

static float getSingleULPForExponent (int exp, int numMantissaBits)
{
	if (numMantissaBits > 0)
	{
		DE_ASSERT(numMantissaBits <= 23);

		const int ulpBitNdx = 23-numMantissaBits;
		return tcu::Float32::construct(+1, exp, (1<<23) | (1 << ulpBitNdx)).asFloat() - tcu::Float32::construct(+1, exp, (1<<23)).asFloat();
	}
	else
	{
		DE_ASSERT(numMantissaBits == 0);
		return tcu::Float32::construct(+1, exp, (1<<23)).asFloat();
	}
}